

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O0

int stbi_is_hdr_from_callbacks(stbi_io_callbacks *clbk,void *user)

{
  int iVar1;
  stbi__context s;
  stbi_io_callbacks *in_stack_ffffffffffffff18;
  stbi__context *in_stack_ffffffffffffff20;
  
  stbi__start_callbacks(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,(void *)0x19fb2f);
  iVar1 = stbi__hdr_test(in_stack_ffffffffffffff20);
  return iVar1;
}

Assistant:

STBIDEF int      stbi_is_hdr_from_callbacks(stbi_io_callbacks const *clbk, void *user)
{
   #ifndef STBI_NO_HDR
   stbi__context s;
   stbi__start_callbacks(&s, (stbi_io_callbacks *) clbk, user);
   return stbi__hdr_test(&s);
   #else
   STBI_NOTUSED(clbk);
   STBI_NOTUSED(user);
   return 0;
   #endif
}